

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O1

Surface * __thiscall SDL2pp::Surface::SetClipRect(Surface *this,Optional<Rect> *rect)

{
  int iVar1;
  Exception *this_00;
  
  if ((rect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == false) {
    rect = (Optional<Rect> *)0x0;
  }
  iVar1 = SDL_SetClipRect(this->surface_,rect);
  if (iVar1 == 1) {
    return this;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_SetClipRect");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Surface& Surface::SetClipRect(const Optional<Rect>& rect) {
	if (SDL_SetClipRect(surface_, rect ? &*rect : nullptr) != SDL_TRUE)
		throw Exception("SDL_SetClipRect");
	return *this;
}